

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O3

bov_text_t * bov_text_update(bov_text_t *text,GLubyte *string)

{
  long lVar1;
  GLsizei GVar2;
  size_t sVar3;
  GLfloat *data;
  bov_text_t *pbVar4;
  int iVar5;
  GLenum extraout_EDX;
  int extraout_EDX_00;
  GLubyte *pGVar6;
  void *__size;
  bov_text_t *pbVar7;
  int iVar8;
  
  pGVar6 = string;
  sVar3 = strlen((char *)string);
  data = text->data;
  iVar8 = (int)sVar3;
  if (text->dataCapacity < iVar8) {
    free(data);
    __size = (void *)((long)iVar8 * 0x60);
    data = (GLfloat *)malloc((size_t)__size);
    text->data = data;
    if (data == (GLfloat *)0x0) {
      bov_text_update_cold_1();
      iVar8 = (int)pGVar6;
      pbVar7 = (bov_text_t *)0x50;
      pbVar4 = (bov_text_t *)malloc(0x50);
      if (pbVar4 != (bov_text_t *)0x0) {
        iVar5 = iVar8;
        if (__size == (void *)0x0) {
          iVar5 = 0;
        }
        pbVar4->vboLen = iVar5;
        *(undefined8 *)&pbVar4->dataCapacity = 0;
        pbVar4->data = (GLfloat *)0x3f80000000000000;
        (pbVar4->param).fillColor[0] = 1.0;
        (pbVar4->param).fillColor[1] = 1.0;
        (pbVar4->param).fillColor[2] = 1.0;
        (pbVar4->param).fillColor[3] = 1.0;
        (pbVar4->param).outlineColor[0] = 0.0;
        (pbVar4->param).outlineColor[1] = 0.0;
        (pbVar4->param).outlineColor[2] = 1.0;
        (pbVar4->param).outlineColor[3] = 1.0;
        (pbVar4->param).pos[0] = 0.025;
        (pbVar4->param).pos[1] = 0.0;
        (pbVar4->param).shift[0] = -1.0;
        (pbVar4->param).shift[1] = 0.0;
        (*glad_glGenVertexArrays)(1,(GLuint *)pbVar4);
        (*glad_glBindVertexArray)(pbVar4->vao);
        (*glad_glGenBuffers)(1,&pbVar4->vbo);
        (*glad_glBindBuffer)(0x8892,pbVar4->vbo);
        (*glad_glVertexAttribPointer)(0,2,0x1406,'\0',0,(void *)0x0);
        (*glad_glEnableVertexAttribArray)(0);
        (*glad_glBufferData)(0x8892,(long)iVar8 * 8,__size,extraout_EDX);
        pbVar4->vboCapacity = iVar8;
        return pbVar4;
      }
      bov_points_new_cold_1();
      iVar8 = 0;
      if (pGVar6 != (GLubyte *)0x0) {
        iVar8 = extraout_EDX_00;
      }
      pbVar7->vboLen = iVar8;
      (*glad_glBindBuffer)(0x8892,pbVar7->vbo);
      if (pbVar7->vboCapacity < extraout_EDX_00) {
        (*glad_glBufferData)(0x8892,(long)extraout_EDX_00 << 3,pGVar6,0x88e8);
        pbVar7->vboCapacity = extraout_EDX_00;
      }
      else if (pGVar6 != (GLubyte *)0x0) {
        (*glad_glBufferSubData)(0x8892,0,(long)extraout_EDX_00 << 3,pGVar6);
      }
      return pbVar7;
    }
    text->dataCapacity = iVar8;
  }
  GVar2 = fill_text_data(data,string,iVar8);
  text->vboLen = GVar2;
  (*glad_glBindBuffer)(0x8892,text->vbo);
  lVar1 = (long)text->vboLen * 0x60;
  if (text->vboCapacity < text->vboLen) {
    (*glad_glBufferData)(0x8892,lVar1,text->data,0x88e8);
    text->vboCapacity = text->vboLen;
  }
  else {
    (*glad_glBufferSubData)(0x8892,0,lVar1,text->data);
  }
  return text;
}

Assistant:

bov_text_t* bov_text_update(bov_text_t* text, const GLubyte* string)
{
	// see if the length is not longer than the original string
	GLsizei newLen = (GLsizei) strlen((const char*)string);

	if(newLen > text->dataCapacity) {
		free(text->data);
		text->data = malloc(sizeof(GLfloat) * 24 * newLen);
		CHECK_MALLOC(text->data);
		text->dataCapacity = newLen;
	}


	// text->string = string;
	text->vboLen = fill_text_data(text->data, string, newLen);

	glBindBuffer(GL_ARRAY_BUFFER, text->vbo);
	if(text->vboLen > text->vboCapacity) {
		glBufferData(GL_ARRAY_BUFFER,
		             sizeof(GLfloat) * 24 * text->vboLen,
		             text->data,
		             GL_DYNAMIC_DRAW);
		text->vboCapacity = text->vboLen;
	}
	else{
		glBufferSubData(GL_ARRAY_BUFFER,
		                0,
		                sizeof(GLfloat) * 24 * text->vboLen,
		                text->data);
	}

	return text;
}